

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_digest.c
# Opt level: O2

CURLdigest Curl_input_digest(connectdata *conn,_Bool proxy,char *header)

{
  byte bVar1;
  byte bVar2;
  SessionHandle *pSVar3;
  char *pcVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  ushort **ppuVar8;
  long lVar9;
  char *pcVar10;
  char *pcVar11;
  bool bVar12;
  uint uVar13;
  byte *pbVar14;
  byte *pbVar15;
  undefined7 in_register_00000031;
  ulong uVar16;
  digestdata *d;
  bool bVar17;
  char *tok_buf;
  char value [256];
  char content [1024];
  
  pSVar3 = conn->data;
  iVar7 = Curl_raw_nequal("Digest",header,6);
  if (iVar7 == 0) {
    return CURLDIGEST_NONE;
  }
  uVar13 = (int)CONCAT71(in_register_00000031,proxy) << 6;
  d = (digestdata *)((long)&(pSVar3->state).digest.nonce + (ulong)uVar13);
  pbVar15 = (byte *)(header + 6);
  pcVar4 = d->nonce;
  digest_cleanup_one(d);
  bVar6 = false;
  bVar12 = false;
  pbVar14 = pbVar15;
  do {
    while( true ) {
      pbVar14 = pbVar14 + 1;
      uVar16 = (ulong)*pbVar15;
      if ((uVar16 == 0) ||
         (ppuVar8 = __ctype_b_loc(), (*(byte *)((long)*ppuVar8 + uVar16 * 2 + 1) & 0x20) == 0))
      break;
      pbVar15 = pbVar15 + 1;
    }
    lVar9 = 0;
    while( true ) {
      if ((((char)uVar16 == '\0') || ((int)uVar16 == 0x3d)) || ((int)lVar9 == 0xff)) break;
      value[lVar9] = (char)uVar16;
      uVar16 = (ulong)*pbVar14;
      pbVar14 = pbVar14 + 1;
      lVar9 = lVar9 + 1;
    }
    value[lVar9] = '\0';
    if (pbVar14[-1] != 0x3d) {
      if ((pcVar4 != (char *)0x0) && ((&(pSVar3->state).digest.stale)[uVar13] != true)) {
        return CURLDIGEST_BAD;
      }
      return (uint)(d->nonce != (char *)0x0) * 3 + CURLDIGEST_BAD;
    }
    bVar1 = *pbVar14;
    pbVar15 = pbVar14 + 1;
    if (bVar1 != 0x22) {
      pbVar15 = pbVar14;
    }
    iVar7 = 0x3ff;
    bVar5 = false;
    pbVar14 = (byte *)content;
    while ((bVar2 = *pbVar15, bVar2 != 0 && (bVar17 = iVar7 != 0, iVar7 = iVar7 + -1, bVar17))) {
      if ((bVar2 == 10) || (bVar2 == 0xd)) {
LAB_004fe69d:
        iVar7 = 0;
      }
      else {
        if (bVar2 == 0x22) {
          if ((!bVar5) && (bVar1 == 0x22)) goto LAB_004fe69d;
LAB_004fe6a1:
          bVar17 = false;
        }
        else {
          if (bVar2 == 0x2c) {
            if (bVar1 != 0x22) goto LAB_004fe69d;
            goto LAB_004fe6a1;
          }
          if ((bVar2 != 0x5c) || (bVar17 = true, bVar5)) goto LAB_004fe6a1;
        }
        bVar5 = bVar17;
        *pbVar14 = bVar2;
        pbVar14 = pbVar14 + 1;
      }
      pbVar15 = pbVar15 + 1;
    }
    *pbVar14 = 0;
    iVar7 = Curl_raw_equal(value,"nonce");
    if (iVar7 != 0) {
      pcVar10 = (*Curl_cstrdup)(content);
      d->nonce = pcVar10;
      goto LAB_004fe6d7;
    }
    iVar7 = Curl_raw_equal(value,"stale");
    if (iVar7 != 0) {
      iVar7 = Curl_raw_equal(content,"true");
      if (iVar7 != 0) {
        (&(pSVar3->state).digest.stale)[uVar13] = true;
        *(undefined4 *)((long)&(pSVar3->state).digest.nc + (ulong)uVar13) = 1;
      }
      goto LAB_004fe6e0;
    }
    iVar7 = Curl_raw_equal(value,"realm");
    if (iVar7 == 0) {
      iVar7 = Curl_raw_equal(value,"opaque");
      if (iVar7 != 0) {
        pcVar10 = (*Curl_cstrdup)(content);
        *(char **)((long)&(pSVar3->state).digest.opaque + (ulong)uVar13) = pcVar10;
        goto LAB_004fe6d7;
      }
      iVar7 = Curl_raw_equal(value,"qop");
      if (iVar7 != 0) {
        pcVar11 = (*Curl_cstrdup)(content);
        pcVar10 = pcVar11;
        if (pcVar11 == (char *)0x0) {
          return CURLDIGEST_NOMEM;
        }
        while (pcVar10 = strtok_r(pcVar10,",",&tok_buf), pcVar10 != (char *)0x0) {
          iVar7 = Curl_raw_equal(pcVar10,"auth");
          if (iVar7 == 0) {
            iVar7 = Curl_raw_equal(pcVar10,"auth-int");
            bVar12 = (bool)(bVar12 | iVar7 != 0);
          }
          else {
            bVar6 = true;
          }
          pcVar10 = (char *)0x0;
        }
        (*Curl_cfree)(pcVar11);
        if (bVar6) {
          pcVar10 = "auth";
        }
        else {
          if (!bVar12) goto LAB_004fe6e0;
          pcVar10 = "auth-int";
        }
        pcVar10 = (*Curl_cstrdup)(pcVar10);
        *(char **)((long)&(pSVar3->state).digest.qop + (ulong)uVar13) = pcVar10;
        goto LAB_004fe6d7;
      }
      iVar7 = Curl_raw_equal(value,"algorithm");
      if (iVar7 != 0) {
        pcVar10 = (*Curl_cstrdup)(content);
        *(char **)((long)&(pSVar3->state).digest.algorithm + (ulong)uVar13) = pcVar10;
        if (pcVar10 == (char *)0x0) {
          return CURLDIGEST_NOMEM;
        }
        iVar7 = Curl_raw_equal(content,"MD5-sess");
        if (iVar7 == 0) {
          iVar7 = Curl_raw_equal(content,"MD5");
          if (iVar7 == 0) {
            return CURLDIGEST_BADALGO;
          }
          *(undefined4 *)((long)&(pSVar3->state).digest.algo + (ulong)uVar13) = 0;
        }
        else {
          *(undefined4 *)((long)&(pSVar3->state).digest.algo + (ulong)uVar13) = 1;
        }
      }
    }
    else {
      pcVar10 = (*Curl_cstrdup)(content);
      *(char **)((long)&(pSVar3->state).digest.realm + (ulong)uVar13) = pcVar10;
LAB_004fe6d7:
      if (pcVar10 == (char *)0x0) {
        return CURLDIGEST_NOMEM;
      }
    }
LAB_004fe6e0:
    while( true ) {
      bVar1 = *pbVar15;
      pbVar14 = pbVar15;
      if ((ulong)bVar1 == 0) break;
      ppuVar8 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar8 + (ulong)bVar1 * 2 + 1) & 0x20) == 0) {
        pbVar15 = pbVar15 + (bVar1 == 0x2c);
        pbVar14 = pbVar15;
        break;
      }
      pbVar15 = pbVar15 + 1;
    }
  } while( true );
}

Assistant:

CURLdigest Curl_input_digest(struct connectdata *conn,
                             bool proxy,
                             const char *header) /* rest of the *-authenticate:
                                                    header */
{
  char *token = NULL;
  char *tmp = NULL;
  bool foundAuth = FALSE;
  bool foundAuthInt = FALSE;
  struct SessionHandle *data=conn->data;
  bool before = FALSE; /* got a nonce before */
  struct digestdata *d;

  if(proxy) {
    d = &data->state.proxydigest;
  }
  else {
    d = &data->state.digest;
  }

  if(checkprefix("Digest", header)) {
    header += strlen("Digest");

    /* If we already have received a nonce, keep that in mind */
    if(d->nonce)
      before = TRUE;

    /* clear off any former leftovers and init to defaults */
    digest_cleanup_one(d);

    for(;;) {
      char value[MAX_VALUE_LENGTH];
      char content[MAX_CONTENT_LENGTH];

      while(*header && ISSPACE(*header))
        header++;

      /* extract a value=content pair */
      if(!get_pair(header, value, content, &header)) {
        if(Curl_raw_equal(value, "nonce")) {
          d->nonce = strdup(content);
          if(!d->nonce)
            return CURLDIGEST_NOMEM;
        }
        else if(Curl_raw_equal(value, "stale")) {
          if(Curl_raw_equal(content, "true")) {
            d->stale = TRUE;
            d->nc = 1; /* we make a new nonce now */
          }
        }
        else if(Curl_raw_equal(value, "realm")) {
          d->realm = strdup(content);
          if(!d->realm)
            return CURLDIGEST_NOMEM;
        }
        else if(Curl_raw_equal(value, "opaque")) {
          d->opaque = strdup(content);
          if(!d->opaque)
            return CURLDIGEST_NOMEM;
        }
        else if(Curl_raw_equal(value, "qop")) {
          char *tok_buf;
          /* tokenize the list and choose auth if possible, use a temporary
             clone of the buffer since strtok_r() ruins it */
          tmp = strdup(content);
          if(!tmp)
            return CURLDIGEST_NOMEM;
          token = strtok_r(tmp, ",", &tok_buf);
          while(token != NULL) {
            if(Curl_raw_equal(token, "auth")) {
              foundAuth = TRUE;
            }
            else if(Curl_raw_equal(token, "auth-int")) {
              foundAuthInt = TRUE;
            }
            token = strtok_r(NULL, ",", &tok_buf);
          }
          free(tmp);
          /*select only auth o auth-int. Otherwise, ignore*/
          if(foundAuth) {
            d->qop = strdup("auth");
            if(!d->qop)
              return CURLDIGEST_NOMEM;
          }
          else if(foundAuthInt) {
            d->qop = strdup("auth-int");
            if(!d->qop)
              return CURLDIGEST_NOMEM;
          }
        }
        else if(Curl_raw_equal(value, "algorithm")) {
          d->algorithm = strdup(content);
          if(!d->algorithm)
            return CURLDIGEST_NOMEM;
          if(Curl_raw_equal(content, "MD5-sess"))
            d->algo = CURLDIGESTALGO_MD5SESS;
          else if(Curl_raw_equal(content, "MD5"))
            d->algo = CURLDIGESTALGO_MD5;
          else
            return CURLDIGEST_BADALGO;
        }
        else {
          /* unknown specifier, ignore it! */
        }
      }
      else
        break; /* we're done here */

      /* pass all additional spaces here */
      while(*header && ISSPACE(*header))
        header++;
      if(',' == *header)
        /* allow the list to be comma-separated */
        header++;
    }
    /* We had a nonce since before, and we got another one now without
       'stale=true'. This means we provided bad credentials in the previous
       request */
    if(before && !d->stale)
      return CURLDIGEST_BAD;

    /* We got this header without a nonce, that's a bad Digest line! */
    if(!d->nonce)
      return CURLDIGEST_BAD;
  }
  else
    /* else not a digest, get out */
    return CURLDIGEST_NONE;

  return CURLDIGEST_FINE;
}